

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# std_controller.cpp
# Opt level: O3

void __thiscall so_5::stats::impl::std_controller_t::turn_off(std_controller_t *this)

{
  int iVar1;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->m_start_stop_lock);
  if (iVar1 != 0) {
    std::__throw_system_error(iVar1);
  }
  if ((this->m_distribution_thread)._M_t.
      super___uniq_ptr_impl<std::thread,_std::default_delete<std::thread>_>._M_t.
      super__Tuple_impl<0UL,_std::thread_*,_std::default_delete<std::thread>_>.
      super__Head_base<0UL,_std::thread_*,_false>._M_head_impl != (thread *)0x0) {
    iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->m_data_lock);
    if (iVar1 != 0) {
      std::__throw_system_error(iVar1);
    }
    this->m_shutdown_initiated = true;
    std::condition_variable::notify_one();
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_data_lock);
    std::thread::join();
    std::__uniq_ptr_impl<std::thread,_std::default_delete<std::thread>_>::reset
              ((__uniq_ptr_impl<std::thread,_std::default_delete<std::thread>_> *)
               &this->m_distribution_thread,(pointer)0x0);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_start_stop_lock);
  return;
}

Assistant:

void
std_controller_t::turn_off()
	{
		std::lock_guard< std::mutex > lock{ m_start_stop_lock };

		if( m_distribution_thread )
			{
				{
					// Send shutdown signal to work thread.
					std::lock_guard< std::mutex > cond_lock{ m_data_lock };
					m_shutdown_initiated = true;

					m_wake_up_cond.notify_one();
				}

				// Wait for work thread termination.
				m_distribution_thread->join();

				// Pointer to work thread must be dropped.
				// This allows to start new working thread.
				m_distribution_thread.reset();
			}
	}